

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

int pbrt::rply_vertex_callback(p_ply_argument argument)

{
  double dVar1;
  long flags;
  long index;
  Float *buffer;
  
  ply_get_argument_user_data(argument,&buffer,&flags);
  ply_get_argument_element(argument,(p_ply_element *)0x0,&index);
  dVar1 = ply_get_argument_value(argument);
  buffer[(ulong)((uint)flags >> 4 & 0xf) * index + (ulong)((uint)flags & 0xf)] = (float)dVar1;
  return 1;
}

Assistant:

int rply_vertex_callback(p_ply_argument argument) {
    Float *buffer;
    long index, flags;

    ply_get_argument_user_data(argument, (void **)&buffer, &flags);
    ply_get_argument_element(argument, nullptr, &index);

    int stride = (flags & 0x0F0) >> 4;
    int offset = flags & 0x00F;

    buffer[index * stride + offset] = (float)ply_get_argument_value(argument);

    return 1;
}